

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::update(QGraphicsScene *this,QRectF *rect)

{
  ConnectionType CVar1;
  ConnectionType CVar2;
  bool bVar3;
  uint uVar4;
  QGraphicsScenePrivate *pQVar5;
  QGraphicsViewPrivate *pQVar6;
  QGraphicsView **ppQVar7;
  QRectF *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<QRectF>,_bool> pVar8;
  QGraphicsView *view_1;
  add_const_t<QList<QGraphicsView_*>_> *__range3_1;
  QGraphicsView *view;
  add_const_t<QList<QGraphicsView_*>_> *__range3;
  bool directUpdates;
  QGraphicsScenePrivate *d;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  const_iterator __end3;
  const_iterator __begin3;
  QGraphicsViewPrivate *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  ConnectionType in_stack_fffffffffffffefc;
  QObject *in_stack_ffffffffffffff08;
  undefined1 local_b8 [32];
  QGraphicsView **local_98;
  const_iterator local_90;
  const_iterator local_88;
  QGraphicsView **local_80;
  const_iterator local_78;
  const_iterator local_70;
  _Base_ptr local_68;
  undefined1 local_60;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QGraphicsScene *)0x9c0275);
  if (((*(uint *)&pQVar5->field_0xb8 >> 2 & 1) == 0) &&
     ((bVar3 = QRectF::isEmpty(in_RSI), !bVar3 || (bVar3 = QRectF::isNull(in_RSI), bVar3)))) {
    uVar4 = QObjectPrivate::isSignalConnected((uint)pQVar5,SUB41(pQVar5->changedSignalIndex,0));
    in_stack_fffffffffffffefc = in_stack_fffffffffffffefc & 0xffffff;
    if ((uVar4 & 1) == 0) {
      bVar3 = QList<QGraphicsView_*>::isEmpty((QList<QGraphicsView_*> *)0x9c02e8);
      in_stack_fffffffffffffefc = CONCAT13(bVar3,(int3)in_stack_fffffffffffffefc) ^ 0xff000000;
    }
    CVar1 = in_stack_fffffffffffffefc & 0x1000000;
    CVar2 = in_stack_fffffffffffffefc & 0x1000000;
    bVar3 = QRectF::isNull(in_RSI);
    if (bVar3) {
      *(uint *)&pQVar5->field_0xb8 = *(uint *)&pQVar5->field_0xb8 & 0xfffffffb | 4;
      std::set<QRectF,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>::clear
                ((set<QRectF,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_> *)
                 0x9c0333);
      if (CVar1 != AutoConnection) {
        local_70.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        local_70 = QList<QGraphicsView_*>::begin
                             ((QList<QGraphicsView_*> *)in_stack_fffffffffffffef0);
        local_78.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_stack_fffffffffffffef0);
        while( true ) {
          local_80 = local_78.i;
          bVar3 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_70,local_78);
          if (!bVar3) break;
          QList<QGraphicsView_*>::const_iterator::operator*(&local_70);
          pQVar6 = QGraphicsView::d_func((QGraphicsView *)0x9c03e9);
          *(uint *)&pQVar6->field_0x300 = *(uint *)&pQVar6->field_0x300 & 0xffffefff | 0x1000;
          QList<QGraphicsView_*>::const_iterator::operator++(&local_70);
        }
      }
    }
    else if (CVar2 == AutoConnection) {
      pVar8 = std::set<QRectF,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_>::
              insert((set<QRectF,_QGraphicsScenePrivate::UpdatedRectsCmp,_std::allocator<QRectF>_> *
                     )CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (value_type *)in_stack_fffffffffffffef0);
      local_68 = (_Base_ptr)pVar8.first._M_node;
      local_60 = pVar8.second;
    }
    else {
      local_88.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = QList<QGraphicsView_*>::begin((QList<QGraphicsView_*> *)in_stack_fffffffffffffef0);
      local_90.i = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
      local_90 = QList<QGraphicsView_*>::end((QList<QGraphicsView_*> *)in_stack_fffffffffffffef0);
      while( true ) {
        local_98 = local_90.i;
        bVar3 = QList<QGraphicsView_*>::const_iterator::operator!=(&local_88,local_90);
        if (!bVar3) break;
        ppQVar7 = QList<QGraphicsView_*>::const_iterator::operator*(&local_88);
        in_stack_ffffffffffffff08 = (QObject *)*ppQVar7;
        bVar3 = QGraphicsView::isTransformed((QGraphicsView *)in_stack_fffffffffffffef0);
        if (bVar3) {
          in_stack_fffffffffffffef0 = QGraphicsView::d_func((QGraphicsView *)0x9c04e0);
          QGraphicsView::viewportTransform((QGraphicsView *)in_stack_ffffffffffffff08);
          QTransform::mapRect((QRectF *)local_b8);
          QGraphicsViewPrivate::updateRectF
                    (in_RDI,(QRectF *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
          ;
        }
        else {
          QGraphicsView::d_func((QGraphicsView *)0x9c0529);
          QGraphicsViewPrivate::updateRectF
                    (in_RDI,(QRectF *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
          ;
        }
        QList<QGraphicsView_*>::const_iterator::operator++(&local_88);
      }
    }
    if ((*(uint *)&pQVar5->field_0xb8 >> 3 & 1) == 0) {
      *(uint *)&pQVar5->field_0xb8 = *(uint *)&pQVar5->field_0xb8 & 0xfffffff7 | 8;
      QMetaObject::invokeMethod<>
                (in_stack_ffffffffffffff08,(char *)in_RDI,in_stack_fffffffffffffefc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::update(const QRectF &rect)
{
    Q_D(QGraphicsScene);
    if (d->updateAll || (rect.isEmpty() && !rect.isNull()))
        return;

    // Check if anyone's connected; if not, we can send updates directly to
    // the views. Otherwise or if there are no views, use old behavior.
    bool directUpdates = !(d->isSignalConnected(d->changedSignalIndex)) && !d->views.isEmpty();
    if (rect.isNull()) {
        d->updateAll = true;
        d->updatedRects.clear();
        if (directUpdates) {
            // Update all views.
            for (auto view : std::as_const(d->views))
                view->d_func()->fullUpdatePending = true;
        }
    } else {
        if (directUpdates) {
            // Update all views.
            for (auto view : std::as_const(d->views)) {
                if (view->isTransformed())
                    view->d_func()->updateRectF(view->viewportTransform().mapRect(rect));
                else
                    view->d_func()->updateRectF(rect);
            }
        } else {
            d->updatedRects.insert(rect);
        }
    }

    if (!d->calledEmitUpdated) {
        d->calledEmitUpdated = true;
        QMetaObject::invokeMethod(this, "_q_emitUpdated", Qt::QueuedConnection);
    }
}